

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.h
# Opt level: O3

int64_t __thiscall ProgramStreamDemuxer::getTrackDelay(ProgramStreamDemuxer *this,int32_t pid)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  longlong lVar4;
  _Base_ptr p_Var5;
  long lVar6;
  int32_t local_c;
  
  p_Var2 = (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (pid <= (int)p_Var2[1]._M_color) {
        p_Var5 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < pid];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= pid)) {
      local_c = pid;
      pmVar3 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
               operator[](&this->m_firstPtsTime,&local_c);
      lVar6 = this->m_firstVideoPTS;
      if (lVar6 == -1) {
        lVar6 = this->m_firstPTS;
      }
      lVar4 = llround((double)(*pmVar3 - lVar6) / 90.0);
      return lVar4;
    }
  }
  return 0;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        if (m_firstPtsTime.find(pid) != m_firstPtsTime.end())
            return llround(
                static_cast<double>(m_firstPtsTime[pid] - (m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS)) /
                90.0);  // convert to ms

        return 0;
    }